

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantArray.h
# Opt level: O0

void __thiscall
flow::ConstantArray::ConstantArray
          (ConstantArray *this,vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *elements
          ,string *name)

{
  LiteralType LVar1;
  const_reference ppCVar2;
  string *name_local;
  vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *elements_local;
  ConstantArray *this_local;
  
  (this->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__ConstantArray_002cafa0;
  ppCVar2 = std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::front(elements);
  LVar1 = Value::type(&(*ppCVar2)->super_Value);
  LVar1 = makeArrayType(this,LVar1);
  Constant::Constant(&this->super_Constant,LVar1,name);
  (this->super_Constant).super_Value._vptr_Value = (_func_int **)&PTR__ConstantArray_002cafa0;
  std::vector<flow::Constant_*,_std::allocator<flow::Constant_*>_>::vector
            (&this->elements_,elements);
  return;
}

Assistant:

ConstantArray(const std::vector<Constant*>& elements,
                const std::string& name = "")
      : Constant(makeArrayType(elements.front()->type()), name),
        elements_(elements) {}